

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int parse_args_TEXLD(Context_conflict2 *ctx)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  
  if (1 < ctx->major_ver) {
    parse_destination_token(ctx);
    require_comma(ctx);
    iVar1 = parse_source_token_maybe_relative(ctx,1);
    require_comma(ctx);
    iVar2 = parse_source_token_maybe_relative(ctx,1);
    return iVar2 + iVar1 + 2;
  }
  bVar3 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar3 = ctx->minor_ver;
  }
  if (((uint)bVar3 | (uint)ctx->major_ver << 0x10) < 0x10004) {
    parse_destination_token(ctx);
    return 2;
  }
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = parse_source_token_maybe_relative(ctx,1);
  return iVar1 + 2;
}

Assistant:

static int parse_args_TEXLD(Context *ctx)
{
    // different registers in px_1_3, ps_1_4, and ps_2_0!
    if (shader_version_atleast(ctx, 2, 0))
        return parse_args_DSS(ctx);
    else if (shader_version_atleast(ctx, 1, 4))
        return parse_args_DS(ctx);
    return parse_args_D(ctx);
}